

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

TestRegistry * TestRegistry::getCurrentRegistry(void)

{
  int iVar1;
  TestRegistry *local_18;
  TestRegistry *in_stack_fffffffffffffff0;
  
  if (getCurrentRegistry()::registry == '\0') {
    iVar1 = __cxa_guard_acquire(&getCurrentRegistry()::registry);
    if (iVar1 != 0) {
      TestRegistry(in_stack_fffffffffffffff0);
      __cxa_atexit(~TestRegistry,&getCurrentRegistry::registry,&__dso_handle);
      __cxa_guard_release(&getCurrentRegistry()::registry);
    }
  }
  if (currentRegistry_ == (TestRegistry *)0x0) {
    local_18 = &getCurrentRegistry::registry;
  }
  else {
    local_18 = currentRegistry_;
  }
  return local_18;
}

Assistant:

TestRegistry* TestRegistry::getCurrentRegistry()
{
    static TestRegistry registry;
    return (currentRegistry_ == NULLPTR) ? &registry : currentRegistry_;
}